

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Promise<unsigned_long> __thiscall
kj::PausableReadAsyncIoStream::tryReadImpl
          (PausableReadAsyncIoStream *this,void *buffer,size_t minBytes,size_t maxBytes)

{
  anon_class_32_4_a4bd11c1 local_50;
  size_t local_30;
  size_t maxBytes_local;
  size_t minBytes_local;
  void *buffer_local;
  PausableReadAsyncIoStream *this_local;
  
  local_50.buffer = (void **)&minBytes_local;
  local_50.minBytes = &maxBytes_local;
  local_50.maxBytes = &local_30;
  local_50.this = (PausableReadAsyncIoStream *)buffer;
  maxBytes_local = maxBytes;
  minBytes_local = minBytes;
  buffer_local = buffer;
  this_local = this;
  evalNow<kj::PausableReadAsyncIoStream::tryReadImpl(void*,unsigned_long,unsigned_long)::__0>
            ((kj *)this,&local_50);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<size_t> PausableReadAsyncIoStream::tryReadImpl(
    void* buffer, size_t minBytes, size_t maxBytes) {
  // Hack: evalNow used here because `newAdaptedPromise` has a bug. We may need to change
  // `PromiseDisposer::alloc` to not be `noexcept` but in order to do so we'll need to benchmark
  // its performance.
  return kj::evalNow([&]() -> kj::Promise<size_t> {
    return inner->tryRead(buffer, minBytes, maxBytes).attach(trackRead());
  });
}